

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

lu_byte luaH_getint(Table *t,lua_Integer key,TValue *res)

{
  uint uVar1;
  TValue *val;
  lu_byte tag;
  uint k;
  TValue *res_local;
  lua_Integer key_local;
  Table *t_local;
  
  uVar1 = checkrange(key,t->asize);
  if (uVar1 == 0) {
    val = getintfromhash(t,key);
    t_local._7_1_ = finishnodeget(val,res);
  }
  else {
    t_local._7_1_ = *(byte *)((long)t->array + (ulong)(uVar1 - 1) + 4);
    if ((t_local._7_1_ & 0xf) != 0) {
      res->tt_ = t_local._7_1_;
      res->value_ = t->array[-1 - (ulong)(uVar1 - 1)];
    }
  }
  return t_local._7_1_;
}

Assistant:

lu_byte luaH_getint (Table *t, lua_Integer key, TValue *res) {
  unsigned k = ikeyinarray(t, key);
  if (k > 0) {
    lu_byte tag = *getArrTag(t, k - 1);
    if (!tagisempty(tag))
      farr2val(t, k - 1, tag, res);
    return tag;
  }
  else
    return finishnodeget(getintfromhash(t, key), res);
}